

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::ClangShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llbuild::basic::QueueJobContext*)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  _func_int *p_Var1;
  long lVar2;
  BuildEngineDelegate *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  char *pcVar7;
  ulong uVar8;
  TaskInterface local_b8;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong *local_98;
  long local_90;
  ulong local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  void *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar7 = message.Data;
  local_b8.impl = *(void **)((long)this + 8);
  local_b8.ctx = *(void **)((long)this + 0x10);
  pBVar3 = llbuild::core::TaskInterface::delegate(&local_b8);
  p_Var1 = pBVar3[1]._vptr_BuildEngineDelegate[1];
  lVar2 = *(long *)((long)this + 0x18);
  local_58 = this;
  std::operator+(&local_50,"error reading dependency file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar2 + 0x150));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_88 = *puVar6;
    uStack_80 = (undefined4)plVar4[3];
    uStack_7c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar6;
    local_98 = (ulong *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_78 = &local_68;
  if (pcVar7 == (char *)0x0) {
    local_70 = 0;
    local_68 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,pcVar7,pcVar7 + message.Length);
  }
  uVar8 = 0xf;
  if (local_98 != &local_88) {
    uVar8 = local_88;
  }
  if (uVar8 < (ulong)(local_70 + local_90)) {
    uVar8 = 0xf;
    if (local_78 != &local_68) {
      uVar8 = CONCAT71(uStack_67,local_68);
    }
    if ((ulong)(local_70 + local_90) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
      goto LAB_0013e5e5;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78);
LAB_0013e5e5:
  local_b8.impl = &local_a8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a8 = *plVar4;
    uStack_a0 = *(undefined4 *)(puVar5 + 3);
    uStack_9c = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_a8 = *plVar4;
    local_b8.impl = (long *)*puVar5;
  }
  local_b8.ctx = (void *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  (**(code **)(*(long *)p_Var1 + 0x58))(p_Var1,lVar2,local_b8.impl,local_b8.ctx);
  if ((long *)local_b8.impl != &local_a8) {
    operator_delete(local_b8.impl,local_a8 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(int *)((long)local_58 + 0x20) = *(int *)((long)local_58 + 0x20) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + command->depsPath +
                       "': " + message.str());
        ++numErrors;
      }